

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextElement.cpp
# Opt level: O2

void __thiscall KDReports::TextElement::TextElement(TextElement *this,TextElement *other)

{
  TextElementPrivate *this_00;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__TextElement_001701c0;
  this_00 = (TextElementPrivate *)operator_new(0x80);
  TextElementPrivate::TextElementPrivate
            (this_00,(other->d)._M_t.
                     super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
                     .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
  .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

KDReports::TextElement::TextElement(const TextElement &other)
    : Element(other)
    , d(new TextElementPrivate(*other.d))
{
}